

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

void __thiscall ON_BrepEdge::ON_BrepEdge(ON_BrepEdge *this)

{
  ON_CurveProxy::ON_CurveProxy(&this->super_ON_CurveProxy,(ON_Curve *)0x0);
  (this->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0081b4b8;
  this->m_status = ON_ComponentStatus::NoneSet;
  this->m_reserved1 = 0;
  this->m_edge_index = -1;
  this->m_c3i = -1;
  (this->m_ti)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  (this->m_ti).m_a = (int *)0x0;
  (this->m_ti).m_count = 0;
  (this->m_ti).m_capacity = 0;
  this->m_tolerance = -1.23432101234321e+308;
  this->m_brep = (ON_Brep *)0x0;
  (this->m_edge_user).h = 0;
  this->m_vi[0] = -1;
  this->m_vi[1] = -1;
  return;
}

Assistant:

ON_BrepEdge::ON_BrepEdge() 
  : ON_CurveProxy(0)
{
  memset(&m_edge_user,0,sizeof(m_edge_user));
  m_vi[0] = m_vi[1] = -1;
}